

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiColumnsFlags flags)

{
  ImGuiContext *pIVar1;
  ImGuiID id_00;
  ImGuiWindow *this;
  ImGuiColumnsSet *pIVar2;
  float fVar3;
  float fVar4;
  float local_9c;
  char *local_98;
  int local_84;
  ImRect local_80;
  float local_70;
  float local_6c;
  float clip_x2;
  float clip_x1;
  ImGuiColumnData *column_1;
  int n_1;
  ImGuiColumnData column;
  int n;
  float content_region_width;
  ImGuiColumnsSet *columns;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiColumnsFlags flags_local;
  int columns_count_local;
  char *str_id_local;
  
  pIVar1 = GImGui;
  this = GetCurrentWindow();
  if (columns_count < 2) {
    __assert_fail("columns_count > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x3253,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
  }
  if ((this->DC).ColumnsSet != (ImGuiColumnsSet *)0x0) {
    __assert_fail("window->DC.ColumnsSet == __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x3254,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
  }
  local_84 = columns_count;
  if (str_id != (char *)0x0) {
    local_84 = 0;
  }
  PushID(local_84 + 0x11223347);
  local_98 = str_id;
  if (str_id == (char *)0x0) {
    local_98 = "columns";
  }
  id_00 = ImGuiWindow::GetID(this,local_98,(char *)0x0);
  PopID();
  pIVar2 = FindOrAddColumnsSet(this,id_00);
  if (pIVar2->ID != id_00) {
    __assert_fail("columns->ID == id",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x325e,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
  }
  pIVar2->Current = 0;
  pIVar2->Count = columns_count;
  pIVar2->Flags = flags;
  (this->DC).ColumnsSet = pIVar2;
  fVar3 = (this->SizeContentsExplicit).x;
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    local_9c = (this->SizeContentsExplicit).x;
  }
  else {
    local_9c = (this->InnerClipRect).Max.x - (this->Pos).x;
  }
  column.ClipRect.Max.y = local_9c;
  pIVar2->MinX = (this->DC).IndentX - (pIVar1->Style).ItemSpacing.x;
  fVar3 = ImMax<float>(local_9c - (this->Scroll).x,pIVar2->MinX + 1.0);
  pIVar2->MaxX = fVar3;
  pIVar2->StartPosY = (this->DC).CursorPos.y;
  pIVar2->StartMaxPosX = (this->DC).CursorMaxPos.x;
  fVar3 = (this->DC).CursorPos.y;
  pIVar2->LineMaxY = fVar3;
  pIVar2->LineMinY = fVar3;
  (this->DC).ColumnsOffsetX = 0.0;
  (this->DC).CursorPos.x =
       (float)(int)((this->Pos).x + (this->DC).IndentX + (this->DC).ColumnsOffsetX);
  if (((pIVar2->Columns).Size != 0) && ((pIVar2->Columns).Size != columns_count + 1)) {
    ImVector<ImGuiColumnData>::resize(&pIVar2->Columns,0);
  }
  pIVar2->IsFirstFrame = (pIVar2->Columns).Size == 0;
  if ((pIVar2->Columns).Size == 0) {
    ImVector<ImGuiColumnData>::reserve(&pIVar2->Columns,columns_count + 1);
    for (column.ClipRect.Max.x = 0.0; (int)column.ClipRect.Max.x < columns_count + 1;
        column.ClipRect.Max.x = (float)((int)column.ClipRect.Max.x + 1)) {
      ImGuiColumnData::ImGuiColumnData((ImGuiColumnData *)((long)&column_1 + 4));
      column_1._4_4_ = (float)(int)column.ClipRect.Max.x / (float)columns_count;
      ImVector<ImGuiColumnData>::push_back(&pIVar2->Columns,(value_type *)((long)&column_1 + 4));
    }
  }
  for (column_1._0_4_ = 0; (int)column_1 < columns_count; column_1._0_4_ = (int)column_1 + 1) {
    _clip_x2 = ImVector<ImGuiColumnData>::operator[](&pIVar2->Columns,(int)column_1);
    fVar3 = (this->Pos).x;
    fVar4 = GetColumnOffset((int)column_1);
    local_6c = ImFloor((fVar3 + 0.5 + fVar4) - 1.0);
    fVar3 = (this->Pos).x;
    fVar4 = GetColumnOffset((int)column_1 + 1);
    local_70 = ImFloor((fVar3 + 0.5 + fVar4) - 1.0);
    ImRect::ImRect(&local_80,local_6c,-3.4028235e+38,local_70,3.4028235e+38);
    (_clip_x2->ClipRect).Min = local_80.Min;
    (_clip_x2->ClipRect).Max = local_80.Max;
    ImRect::ClipWith(&_clip_x2->ClipRect,&this->ClipRect);
  }
  ImDrawList::ChannelsSplit(this->DrawList,pIVar2->Count);
  PushColumnClipRect(-1);
  fVar3 = GetColumnWidth(-1);
  PushItemWidth(fVar3 * 0.65);
  return;
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiColumnsFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count > 1);
    IM_ASSERT(window->DC.ColumnsSet == NULL); // Nested columns are currently not supported

    // Differentiate column ID with an arbitrary prefix for cases where users name their columns set the same as another widget.
    // In addition, when an identifier isn't explicitly provided we include the number of columns in the hash to make it uniquer.
    PushID(0x11223347 + (str_id ? 0 : columns_count));
    ImGuiID id = window->GetID(str_id ? str_id : "columns");
    PopID();

    // Acquire storage for the columns set
    ImGuiColumnsSet* columns = FindOrAddColumnsSet(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.ColumnsSet = columns;

    // Set state for first column
    const float content_region_width = (window->SizeContentsExplicit.x != 0.0f) ? (window->SizeContentsExplicit.x) : (window->InnerClipRect.Max.x - window->Pos.x);
    columns->MinX = window->DC.IndentX - g.Style.ItemSpacing.x; // Lock our horizontal range
    columns->MaxX = ImMax(content_region_width - window->Scroll.x, columns->MinX + 1.0f);
    columns->StartPosY = window->DC.CursorPos.y;
    columns->StartMaxPosX = window->DC.CursorMaxPos.x;
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;
    window->DC.ColumnsOffsetX = 0.0f;
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.IndentX + window->DC.ColumnsOffsetX);

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize defaults
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiColumnData* column = &columns->Columns[n];
        float clip_x1 = ImFloor(0.5f + window->Pos.x + GetColumnOffset(n) - 1.0f);
        float clip_x2 = ImFloor(0.5f + window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWith(window->ClipRect);
    }

    window->DrawList->ChannelsSplit(columns->Count);
    PushColumnClipRect();
    PushItemWidth(GetColumnWidth() * 0.65f);
}